

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockExpectedCallTest.cpp
# Opt level: O0

void __thiscall
TEST_MockExpectedCall_callWithStringParameter_TestShell::
TEST_MockExpectedCall_callWithStringParameter_TestShell
          (TEST_MockExpectedCall_callWithStringParameter_TestShell *this)

{
  TEST_MockExpectedCall_callWithStringParameter_TestShell *this_local;
  
  UtestShell::UtestShell(&this->super_UtestShell);
  (this->super_UtestShell)._vptr_UtestShell =
       (_func_int **)&PTR__TEST_MockExpectedCall_callWithStringParameter_TestShell_00337860;
  return;
}

Assistant:

TEST(MockExpectedCall, callWithStringParameter)
{
    const SimpleString paramName = "paramName";
    const char* value = "hello world";
    call->withParameter(paramName, value);
    STRCMP_EQUAL("const char*", call->getInputParameterType(paramName).asCharString());
    STRCMP_EQUAL(value, call->getInputParameter(paramName).getStringValue());
    STRCMP_CONTAINS("funcName -> const char* paramName: <hello world>", call->callToString().asCharString());
}